

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  LodePNGColorType colortype;
  bool bVar1;
  uchar uVar2;
  unsigned_short gray;
  uchar uVar7;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uchar uVar9;
  uchar uVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  uchar *puVar14;
  ulong numpixels;
  size_t __n;
  bool bVar15;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  ColorTree tree;
  unsigned_short local_e8;
  unsigned_short local_e6;
  unsigned_short local_e4;
  unsigned_short local_e2;
  LodePNGColorMode *local_e0;
  uchar *local_d8;
  uchar *local_d0;
  LodePNGColorMode *local_c8;
  uint local_bc;
  ColorTree local_b8;
  uchar uVar8;
  
  colortype = mode_in->colortype;
  if ((colortype == LCT_PALETTE) && (mode_in->palette == (uchar *)0x0)) {
    return 0x6b;
  }
  numpixels = (ulong)h * (ulong)w;
  local_d8 = out;
  local_bc = h;
  iVar3 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar3 != 0) {
    uVar5 = mode_in->bitdepth;
    uVar4 = getNumColorChannels(colortype);
    uVar6 = (ulong)(uVar4 * uVar5);
    __n = (((uint)numpixels & 7) * uVar6 + 7 >> 3) + (numpixels >> 3) * uVar6;
    if (__n == 0) {
      return 0;
    }
    memcpy(local_d8,in,__n);
    return 0;
  }
  uVar5 = 0;
  local_e0 = mode_in;
  if (mode_out->colortype == LCT_PALETTE) {
    uVar6 = mode_out->palettesize;
    uVar11 = 1L << ((byte)mode_out->bitdepth & 0x3f);
    local_d0 = in;
    local_c8 = mode_out;
    if (uVar6 == 0) {
      puVar14 = mode_in->palette;
      uVar6 = mode_in->palettesize;
      if ((colortype != LCT_PALETTE) || (mode_in->bitdepth != mode_out->bitdepth))
      goto LAB_0011d9fd;
      sVar12 = lodepng_get_raw_size(w,local_bc,mode_in);
      in = local_d0;
      if (sVar12 == 0) {
        bVar1 = false;
        uVar5 = 0;
      }
      else {
        memcpy(local_d8,local_d0,sVar12);
        bVar1 = false;
        uVar5 = 0;
      }
    }
    else {
      puVar14 = mode_out->palette;
LAB_0011d9fd:
      if (uVar6 < uVar11) {
        uVar11 = uVar6;
      }
      local_b8.children[0xe] = (ColorTree *)0x0;
      local_b8.children[0xf] = (ColorTree *)0x0;
      local_b8.children[0xc] = (ColorTree *)0x0;
      local_b8.children[0xd] = (ColorTree *)0x0;
      local_b8.children[10] = (ColorTree *)0x0;
      local_b8.children[0xb] = (ColorTree *)0x0;
      local_b8.children[8] = (ColorTree *)0x0;
      local_b8.children[9] = (ColorTree *)0x0;
      local_b8.children[6] = (ColorTree *)0x0;
      local_b8.children[7] = (ColorTree *)0x0;
      local_b8.children[4] = (ColorTree *)0x0;
      local_b8.children[5] = (ColorTree *)0x0;
      local_b8.children[2] = (ColorTree *)0x0;
      local_b8.children[3] = (ColorTree *)0x0;
      local_b8.children[0] = (ColorTree *)0x0;
      local_b8.children[1] = (ColorTree *)0x0;
      local_b8.index = -1;
      bVar1 = true;
      if (uVar6 == 0) {
        uVar5 = 0;
      }
      else {
        lVar13 = 0;
        do {
          uVar5 = color_tree_add(&local_b8,puVar14[lVar13 * 4],puVar14[lVar13 * 4 + 1],
                                 puVar14[lVar13 * 4 + 2],puVar14[lVar13 * 4 + 3],(uint)lVar13);
          in = local_d0;
          if (uVar5 != 0) break;
          bVar15 = uVar11 - 1 != lVar13;
          lVar13 = lVar13 + 1;
        } while (bVar15);
      }
    }
    mode_out = local_c8;
    if (!bVar1) {
      return 0;
    }
  }
  if (uVar5 != 0) goto LAB_0011de5d;
  if ((local_e0->bitdepth == 0x10) && (mode_out->bitdepth == 0x10)) {
    if (numpixels != 0) {
      lVar13 = 0;
      sVar12 = 0;
      do {
        local_e2 = 0;
        local_e4 = 0;
        local_e6 = 0;
        local_e8 = 0;
        getPixelColorRGBA16(&local_e2,&local_e4,&local_e6,&local_e8,in,sVar12,local_e0);
        uVar2 = (uchar)local_e2;
        uVar7 = (uchar)(local_e2 >> 8);
        uVar9 = (uchar)(local_e8 >> 8);
        uVar10 = (uchar)(local_e4 >> 8);
        uVar8 = (uchar)(local_e6 >> 8);
        switch(mode_out->colortype) {
        case LCT_GREY:
          *(unsigned_short *)(local_d8 + sVar12 * 2) = local_e2 << 8 | local_e2 >> 8;
          break;
        case LCT_RGB:
          local_d8[lVar13 * 2] = uVar7;
          local_d8[lVar13 * 2 + 1] = uVar2;
          local_d8[lVar13 * 2 + 2] = uVar10;
          local_d8[lVar13 * 2 + 3] = (uchar)local_e4;
          local_d8[lVar13 * 2 + 4] = uVar8;
          local_d8[lVar13 * 2 + 5] = (uchar)local_e6;
          break;
        case LCT_GREY_ALPHA:
          local_d8[sVar12 * 4] = uVar7;
          local_d8[sVar12 * 4 + 1] = uVar2;
          local_d8[sVar12 * 4 + 2] = uVar9;
          local_d8[sVar12 * 4 + 3] = (uchar)local_e8;
          break;
        case LCT_RGBA:
          local_d8[sVar12 * 8] = uVar7;
          local_d8[sVar12 * 8 + 1] = uVar2;
          local_d8[sVar12 * 8 + 2] = uVar10;
          local_d8[sVar12 * 8 + 3] = (uchar)local_e4;
          local_d8[sVar12 * 8 + 4] = uVar8;
          local_d8[sVar12 * 8 + 5] = (uchar)local_e6;
          local_d8[sVar12 * 8 + 6] = uVar9;
          local_d8[sVar12 * 8 + 7] = (uchar)local_e8;
        }
        sVar12 = sVar12 + 1;
        lVar13 = lVar13 + 3;
      } while (numpixels - sVar12 != 0);
      uVar5 = 0;
      goto LAB_0011de5d;
    }
  }
  else if (mode_out->bitdepth == 8) {
    if (mode_out->colortype == LCT_RGBA) {
      getPixelColorsRGBA8(local_d8,numpixels,in,local_e0);
    }
    else {
      if (mode_out->colortype != LCT_RGB) goto LAB_0011dc30;
      getPixelColorsRGB8(local_d8,numpixels,in,local_e0);
    }
  }
  else {
LAB_0011dc30:
    uVar5 = 0;
    local_e2 = local_e2 & 0xff00;
    local_e4 = local_e4 & 0xff00;
    local_e6 = local_e6 & 0xff00;
    local_e8 = local_e8 & 0xff00;
    if (numpixels == 0) goto LAB_0011de5d;
    sVar12 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_e2,(uchar *)&local_e4,(uchar *)&local_e6,(uchar *)&local_e8
                         ,in,sVar12,local_e0);
      bVar1 = true;
      switch(mode_out->colortype) {
      case LCT_GREY:
        uVar4 = mode_out->bitdepth;
        if (uVar4 == 0x10) {
          local_d8[sVar12 * 2 + 1] = (byte)local_e2;
          local_d8[sVar12 * 2] = (byte)local_e2;
        }
        else if (uVar4 == 8) {
          local_d8[sVar12] = (byte)local_e2;
        }
        else {
          uVar5 = ~(-1 << ((byte)uVar4 & 0x1f)) & (uint)((byte)local_e2 >> (8 - (byte)uVar4 & 0x1f))
          ;
LAB_0011de2f:
          addColorBits(local_d8,sVar12,uVar4,uVar5);
        }
        break;
      case LCT_RGB:
        if (mode_out->bitdepth == 8) {
          lVar13 = sVar12 * 3;
          local_d8[lVar13] = (byte)local_e2;
          local_d8[lVar13 + 1] = (uchar)local_e4;
          local_d8[lVar13 + 2] = (uchar)local_e6;
        }
        else {
          local_d8[sVar12 * 6 + 1] = (byte)local_e2;
          local_d8[sVar12 * 6] = (byte)local_e2;
          local_d8[sVar12 * 6 + 3] = (uchar)local_e4;
          local_d8[sVar12 * 6 + 2] = (uchar)local_e4;
          local_d8[sVar12 * 6 + 5] = (uchar)local_e6;
          local_d8[sVar12 * 6 + 4] = (uchar)local_e6;
        }
        break;
      case LCT_PALETTE:
        uVar5 = color_tree_get(&local_b8,(byte)local_e2,(uchar)local_e4,(uchar)local_e6,
                               (uchar)local_e8);
        if (-1 < (int)uVar5) {
          uVar4 = mode_out->bitdepth;
          if (uVar4 != 8) goto LAB_0011de2f;
          local_d8[sVar12] = (uchar)uVar5;
          break;
        }
        uVar5 = 0x52;
        bVar1 = false;
        goto LAB_0011de49;
      case LCT_GREY_ALPHA:
        if (mode_out->bitdepth != 0x10) {
          if (mode_out->bitdepth == 8) {
            local_d8[sVar12 * 2] = (byte)local_e2;
            local_d8[sVar12 * 2 + 1] = (uchar)local_e8;
          }
          uVar5 = 0;
          goto LAB_0011de49;
        }
        local_d8[sVar12 * 4 + 1] = (byte)local_e2;
        local_d8[sVar12 * 4] = (byte)local_e2;
        local_d8[sVar12 * 4 + 3] = (uchar)local_e8;
        local_d8[sVar12 * 4 + 2] = (uchar)local_e8;
        break;
      case LCT_RGBA:
        if (mode_out->bitdepth == 8) {
          local_d8[sVar12 * 4] = (byte)local_e2;
          local_d8[sVar12 * 4 + 1] = (uchar)local_e4;
          local_d8[sVar12 * 4 + 2] = (uchar)local_e6;
          local_d8[sVar12 * 4 + 3] = (uchar)local_e8;
        }
        else {
          local_d8[sVar12 * 8 + 1] = (byte)local_e2;
          local_d8[sVar12 * 8] = (byte)local_e2;
          local_d8[sVar12 * 8 + 3] = (uchar)local_e4;
          local_d8[sVar12 * 8 + 2] = (uchar)local_e4;
          local_d8[sVar12 * 8 + 5] = (uchar)local_e6;
          local_d8[sVar12 * 8 + 4] = (uchar)local_e6;
          local_d8[sVar12 * 8 + 7] = (uchar)local_e8;
          local_d8[sVar12 * 8 + 6] = (uchar)local_e8;
        }
      }
      uVar5 = 0;
LAB_0011de49:
      if (!bVar1) goto LAB_0011de5d;
      sVar12 = sVar12 + 1;
    } while (sVar12 != numpixels);
  }
  uVar5 = 0;
LAB_0011de5d:
  if (mode_out->colortype == LCT_PALETTE) {
    color_tree_cleanup(&local_b8);
  }
  return uVar5;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  if(mode_in->colortype == LCT_PALETTE && !mode_in->palette) {
    return 107; /* error: must provide palette if input mode is palette */
  }

  if(lodepng_color_mode_equal(mode_out, mode_in)) {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    lodepng_memcpy(out, in, numbytes);
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE) {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = (size_t)1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0) {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
      /*if the input was also palette with same bitdepth, then the color types are also
      equal, so copy literally. This to preserve the exact indices that were in the PNG
      even in case there are duplicate colors in the palette.*/
      if(mode_in->colortype == LCT_PALETTE && mode_in->bitdepth == mode_out->bitdepth) {
        size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
        lodepng_memcpy(out, in, numbytes);
        return 0;
      }
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i) {
      const unsigned char* p = &palette[i * 4];
      error = color_tree_add(&tree, p[0], p[1], p[2], p[3], (unsigned)i);
      if(error) break;
    }
  }

  if(!error) {
    if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16) {
      for(i = 0; i != numpixels; ++i) {
        unsigned short r = 0, g = 0, b = 0, a = 0;
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        rgba16ToPixel(out, i, mode_out, r, g, b, a);
      }
    } else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA) {
      getPixelColorsRGBA8(out, numpixels, in, mode_in);
    } else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB) {
      getPixelColorsRGB8(out, numpixels, in, mode_in);
    } else {
      unsigned char r = 0, g = 0, b = 0, a = 0;
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        error = rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a);
        if(error) break;
      }
    }
  }

  if(mode_out->colortype == LCT_PALETTE) {
    color_tree_cleanup(&tree);
  }

  return error;
}